

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O1

int read_config_info(WavpackContext *wpc,WavpackMetadata *wpmd)

{
  byte bVar1;
  undefined1 *puVar2;
  ushort uVar3;
  uint3 uVar4;
  
  if (2 < wpmd->byte_length) {
    puVar2 = (undefined1 *)wpmd->data;
    bVar1 = (byte)(wpc->config).flags;
    (wpc->config).flags = (uint)bVar1;
    uVar3 = CONCAT11(*puVar2,bVar1);
    (wpc->config).flags = (uint)uVar3;
    uVar4 = CONCAT12(puVar2[1],uVar3);
    (wpc->config).flags = (uint)uVar4;
    (wpc->config).flags = CONCAT13(puVar2[2],uVar4);
  }
  return 1;
}

Assistant:

int read_config_info (WavpackContext *wpc, WavpackMetadata *wpmd)
{
    int bytecnt = wpmd->byte_length;
    uchar *byteptr = wpmd->data;

    if (bytecnt >= 3) {
        wpc->config.flags &= 0xff;
        wpc->config.flags |= (int32_t) *byteptr++ << 8;
        wpc->config.flags |= (int32_t) *byteptr++ << 16;
        wpc->config.flags |= (int32_t) *byteptr << 24;
    }

    return TRUE;
}